

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O0

bool __thiscall
RTIMUSettings::discoverPressure(RTIMUSettings *this,int *pressureType,uchar *pressureAddress)

{
  bool bVar1;
  uchar local_29;
  uchar *puStack_28;
  uchar result;
  uchar *pressureAddress_local;
  int *pressureType_local;
  RTIMUSettings *this_local;
  
  puStack_28 = pressureAddress;
  pressureAddress_local = (uchar *)pressureType;
  pressureType_local = (int *)this;
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'w',0xd0,'\x01',&local_29,"");
    if ((bVar1) && (local_29 == 'U')) {
      pressureAddress_local[0] = '\x02';
      pressureAddress_local[1] = '\0';
      pressureAddress_local[2] = '\0';
      pressureAddress_local[3] = '\0';
      *puStack_28 = 'w';
      printf("%s","Detected BMP180\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\\','\x0f','\x01',&local_29,"");
    if ((bVar1) && (local_29 == 0xbd)) {
      pressureAddress_local[0] = '\x03';
      pressureAddress_local[1] = '\0';
      pressureAddress_local[2] = '\0';
      pressureAddress_local[3] = '\0';
      *puStack_28 = '\\';
      printf("%s","Detected LPS25H at standard address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,']','\x0f','\x01',&local_29,"");
    if ((bVar1) && (local_29 == 0xbd)) {
      pressureAddress_local[0] = '\x03';
      pressureAddress_local[1] = '\0';
      pressureAddress_local[2] = '\0';
      pressureAddress_local[3] = '\0';
      *puStack_28 = ']';
      printf("%s","Detected LPS25H at option address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'v','\0','\x01',&local_29,"");
    if (bVar1) {
      pressureAddress_local[0] = '\x04';
      pressureAddress_local[1] = '\0';
      pressureAddress_local[2] = '\0';
      pressureAddress_local[3] = '\0';
      *puStack_28 = 'v';
      printf("%s","Detected MS5611 at standard address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'w','\0','\x01',&local_29,"");
    if (bVar1) {
      pressureAddress_local[0] = '\x04';
      pressureAddress_local[1] = '\0';
      pressureAddress_local[2] = '\0';
      pressureAddress_local[3] = '\0';
      *puStack_28 = 'w';
      printf("%s","Detected MS5611 at option address\n");
      fflush(_stdout);
      return true;
    }
  }
  fprintf(_stderr,"No pressure sensor detected\n");
  return false;
}

Assistant:

bool RTIMUSettings::discoverPressure(int& pressureType, unsigned char& pressureAddress)
{
    unsigned char result;

    //  auto detect on current bus

    if (HALOpen()) {

        if (HALRead(BMP180_ADDRESS, BMP180_REG_ID, 1, &result, "")) {
            if (result == BMP180_ID) {
                pressureType = RTPRESSURE_TYPE_BMP180;
                pressureAddress = BMP180_ADDRESS;
                HAL_INFO("Detected BMP180\n");
                return true;
            }
        }

        if (HALRead(LPS25H_ADDRESS0, LPS25H_REG_ID, 1, &result, "")) {
            if (result == LPS25H_ID) {
                pressureType = RTPRESSURE_TYPE_LPS25H;
                pressureAddress = LPS25H_ADDRESS0;
                HAL_INFO("Detected LPS25H at standard address\n");
                return true;
            }
        }

        if (HALRead(LPS25H_ADDRESS1, LPS25H_REG_ID, 1, &result, "")) {
            if (result == LPS25H_ID) {
                pressureType = RTPRESSURE_TYPE_LPS25H;
                pressureAddress = LPS25H_ADDRESS1;
                HAL_INFO("Detected LPS25H at option address\n");
                return true;
            }
        }

        // check for MS5611 (which unfortunately has no ID reg)

        if (HALRead(MS5611_ADDRESS0, 0, 1, &result, "")) {
            pressureType = RTPRESSURE_TYPE_MS5611;
            pressureAddress = MS5611_ADDRESS0;
            HAL_INFO("Detected MS5611 at standard address\n");
            return true;
        }
        if (HALRead(MS5611_ADDRESS1, 0, 1, &result, "")) {
            pressureType = RTPRESSURE_TYPE_MS5611;
            pressureAddress = MS5611_ADDRESS1;
            HAL_INFO("Detected MS5611 at option address\n");
            return true;
        }
    }
    HAL_ERROR("No pressure sensor detected\n");
    return false;
}